

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstalledFile.cxx
# Opt level: O2

void __thiscall
cmInstalledFile::AppendProperty
          (cmInstalledFile *this,cmMakefile *mf,string *prop,char *value,bool param_4)

{
  vector<cmCompiledGeneratorExpression*,std::allocator<cmCompiledGeneratorExpression*>> *this_00;
  cmGeneratorExpression ge;
  cmListFileBacktrace backtrace;
  undefined1 local_68 [24];
  __shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> local_50;
  _Head_base<0UL,_cmCompiledGeneratorExpression_*,_false> local_30;
  
  cmMakefile::GetBacktrace((cmMakefile *)&stack0xffffffffffffffc0);
  std::__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_50,
             (__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *)
             &stack0xffffffffffffffc0);
  cmGeneratorExpression::cmGeneratorExpression
            ((cmGeneratorExpression *)(local_68 + 8),(cmListFileBacktrace *)&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  this_00 = (vector<cmCompiledGeneratorExpression*,std::allocator<cmCompiledGeneratorExpression*>> *
            )std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property>_>_>
             ::operator[](&this->Properties,prop);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)local_68,local_68 + 8);
  local_30._M_head_impl = (cmCompiledGeneratorExpression *)local_68._0_8_;
  local_68._0_8_ =
       (__uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
        )0x0;
  std::vector<cmCompiledGeneratorExpression*,std::allocator<cmCompiledGeneratorExpression*>>::
  emplace_back<cmCompiledGeneratorExpression*>(this_00,&stack0xffffffffffffffd0._M_head_impl);
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               *)local_68);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)(local_68 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
  return;
}

Assistant:

void cmInstalledFile::AppendProperty(cmMakefile const* mf,
                                     const std::string& prop,
                                     const char* value, bool /*asString*/)
{
  cmListFileBacktrace backtrace = mf->GetBacktrace();
  cmGeneratorExpression ge(backtrace);

  Property& property = this->Properties[prop];
  property.ValueExpressions.push_back(ge.Parse(value).release());
}